

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v8::detail::
       parse_align<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  specs_checker<fmt::v8::detail::specs_handler<char>_> *this;
  char *s;
  char cVar1;
  int iVar2;
  type count;
  basic_string_view<char> local_50;
  char local_39;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *psStack_38;
  char c;
  char *p;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *psStack_28;
  type align;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *handler_local;
  char *end_local;
  char *begin_local;
  
  psStack_28 = handler;
  handler_local = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end;
  end_local = begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                ,0x8e2,"");
  }
  p._4_4_ = none;
  iVar2 = code_point_length<char>(begin);
  psStack_38 = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)(begin + iVar2);
  if (handler_local <= psStack_38) {
    psStack_38 = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local;
  }
  while( true ) {
    cVar1 = to_ascii<char,_0>(*(char *)&(psStack_38->super_specs_handler<char>).
                                        super_specs_setter<char>.specs_);
    s = end_local;
    this = psStack_28;
    if (cVar1 == '<') {
      p._4_4_ = left;
    }
    else if (cVar1 == '>') {
      p._4_4_ = right;
    }
    else if (cVar1 == '^') {
      p._4_4_ = center;
    }
    if (p._4_4_ != none) break;
    if (psStack_38 == (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local) {
      return end_local;
    }
    psStack_38 = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local;
  }
  if (psStack_38 != (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local) {
    local_39 = *end_local;
    if (local_39 == '{') {
      specs_handler<char>::on_error
                (&psStack_28->super_specs_handler<char>,"invalid fill character \'{\'");
      return end_local;
    }
    count = to_unsigned<long>((long)psStack_38 - (long)end_local);
    basic_string_view<char>::basic_string_view(&local_50,s,count);
    specs_setter<char>::on_fill((specs_setter<char> *)this,local_50);
    end_local = (char *)psStack_38;
  }
  end_local = (char *)((long)&(((specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local)->
                              super_specs_handler<char>).super_specs_setter<char>.specs_ + 1);
  specs_checker<fmt::v8::detail::specs_handler<char>_>::on_align(psStack_28,p._4_4_);
  return end_local;
}

Assistant:

FMT_CONSTEXPR auto parse_align(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
    case '^':
      align = align::center;
      break;
    default:
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}